

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

MakeNet * __thiscall notch::core::MakeNet::addFC(MakeNet *this,size_t n,Activation *af)

{
  logic_error *this_00;
  value_type local_6c;
  undefined1 local_68 [8];
  MakeLayer mk;
  Activation *af_local;
  size_t n_local;
  MakeNet *this_local;
  
  checkConfig(this);
  if (n == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error(this_00,"cannot add a layer with zero outputs");
    __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
  }
  MakeLayer::MakeLayer((MakeLayer *)local_68,this->nOutputs,n,af);
  std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::push_back
            (&this->layerMakers,(MakeLayer *)local_68);
  local_6c = FC;
  std::vector<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>::
  push_back(&this->layerTypes,&local_6c);
  this->nOutputs = n;
  MakeLayer::~MakeLayer((MakeLayer *)local_68);
  return this;
}

Assistant:

MakeNet &addFC(size_t n, const Activation &af = scaledTanh) {
        checkConfig();
        if (!n) {
            throw std::logic_error("cannot add a layer with zero outputs");
        }
        MakeLayer mk(nOutputs, n, af);
        layerMakers.push_back(mk);
        layerTypes.push_back(LayerType::FC);
        nOutputs = n;
        return *this;
    }